

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata256.cpp
# Opt level: O0

void __thiscall
ByteData256_BytesConstructorException_Test::TestBody
          (ByteData256_BytesConstructorException_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0;
  bool local_91;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  ByteData256 byte_data;
  allocator<unsigned_char> local_29;
  undefined1 local_28 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> target;
  ByteData256_BytesConstructorException_Test *this_local;
  
  target.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_char>::allocator(&local_29);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28,0x19,&local_29);
  std::allocator<unsigned_char>::~allocator(&local_29);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)&cfd_except,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)&cfd_except);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_28);
  local_91 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_90,&local_91,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_90,(AssertionResult *)0x6a1824,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_bytedata256.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(ByteData256, BytesConstructorException) {
  try {
    std::vector<uint8_t> target(25);
    ByteData256 byte_data = ByteData256(target);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "ByteData256 size unmatch.");
    return;
  }
  ASSERT_TRUE(false);
}